

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect_p.h
# Opt level: O0

void __thiscall QGraphicsEffectPrivate::QGraphicsEffectPrivate(QGraphicsEffectPrivate *this)

{
  QObjectPrivate *in_RDI;
  
  QObjectPrivate::QObjectPrivate(in_RDI,QObjectPrivateVersion);
  *(undefined ***)in_RDI = &PTR__QGraphicsEffectPrivate_00d0c9b0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  QRectF::QRectF((QRectF *)(in_RDI + 0x80));
  *(uint *)(in_RDI + 0xa0) = *(uint *)(in_RDI + 0xa0) & 0xfffffffe | 1;
  return;
}

Assistant:

inline void setGraphicsEffectSource(QGraphicsEffectSource *newSource)
    {
        QGraphicsEffect::ChangeFlags flags;
        if (source) {
            flags |= QGraphicsEffect::SourceDetached;
            source->d_func()->effectBoundingRectChanged();
            source->d_func()->invalidateCache();
            source->d_func()->detach();
            delete source;
        }
        source = newSource;
        if (newSource)
            flags |= QGraphicsEffect::SourceAttached;
        q_func()->sourceChanged(flags);
    }